

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O1

int universal_argument(int f,int n)

{
  uint c;
  int iVar1;
  PF p_Var2;
  int iVar3;
  long lVar4;
  uint n_00;
  ulong uVar6;
  bool bVar7;
  KEYMAP *local_40;
  KEYMAP *curmap;
  ulong uVar5;
  
  uVar6 = (ulong)(uint)(n << 2);
  uVar5 = 4;
  if ((f & 1U) != 0) {
    uVar5 = uVar6;
  }
  n_00 = (uint)uVar5;
  curmap._4_4_ = f;
  c = getkey(1);
  key.k_chars[0] = (KCHAR)c;
  if (c != 0x2d) {
    do {
      key.k_count = 1;
      if (c - 0x30 < 10) {
        iVar1 = digit_argument(curmap._4_4_,(int)uVar6);
        return iVar1;
      }
      local_40 = curbp->b_modes[curbp->b_nmodes]->p_map;
      while( true ) {
        uVar6 = (ulong)c;
        p_Var2 = doscan(local_40,c,&local_40);
        if (p_Var2 != (PF)0x0) break;
        c = getkey(1);
        lVar4 = (long)key.k_count;
        key.k_count = key.k_count + 1;
        key.k_chars[lVar4] = (KCHAR)c;
      }
      iVar1 = (int)uVar5;
      if (p_Var2 != universal_argument) {
        if (macrocount < 0xff && macrodef != 0) {
          if ((curmap._4_4_ & 7) != 0) {
            macrocount = macrocount + -1;
          }
          lVar4 = (long)macrocount;
          macro[lVar4].m_count = iVar1;
          macrocount = macrocount + 2;
          macro[lVar4 + 1].m_funct = p_Var2;
        }
        if ((((p_Var2 != universal_argument) && (p_Var2 != digit_argument)) && (p_Var2 != rescan))
           && (p_Var2 != negative_argument)) {
          iVar3 = rptcount + 1;
          bVar7 = mgwrap_ofp == p_Var2;
          rptcount = 0;
          mgwrap_ofp = p_Var2;
          if (bVar7) {
            rptcount = iVar3;
          }
        }
        iVar1 = (*p_Var2)(1,iVar1);
        return iVar1;
      }
      n_00 = iVar1 << 2;
      uVar5 = (ulong)n_00;
      c = getkey(1);
      key.k_chars[0] = (KCHAR)c;
    } while (c != 0x2d);
  }
  key.k_count = 1;
  iVar1 = negative_argument(curmap._4_4_,n_00);
  return iVar1;
}

Assistant:

int
universal_argument(int f, int n)
{
	KEYMAP	*curmap;
	PF	 funct;
	int	 c, nn = 4;

	if (f & FFUNIV)
		nn *= n;
	for (;;) {
		key.k_chars[0] = c = getkey(TRUE);
		key.k_count = 1;
		if (c == '-')
			return (negative_argument(f, nn));
		if (c >= '0' && c <= '9')
			return (digit_argument(f, nn));
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
		while ((funct = doscan(curmap, c, &curmap)) == NULL) {
			key.k_chars[key.k_count++] = c = getkey(TRUE);
		}
		if (funct != universal_argument) {
			if (macrodef && macrocount < MAXMACRO - 1) {
				if (f & FFARG)
					macrocount--;
				macro[macrocount++].m_count = nn;
				macro[macrocount++].m_funct = funct;
			}
			return (mgwrap(funct, FFUNIV, nn));
		}
		nn <<= 2;
	}
}